

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.cc
# Opt level: O1

void EVP_EncodeFinal(EVP_ENCODE_CTX *ctx,uchar *out,int *outl)

{
  int iVar1;
  undefined4 extraout_var;
  ulong uVar2;
  
  if (ctx->num == 0) {
    uVar2 = 0;
  }
  else {
    iVar1 = EVP_EncodeBlock(out,(uchar *)&ctx->length,ctx->num);
    (out + CONCAT44(extraout_var,iVar1))[0] = '\n';
    (out + CONCAT44(extraout_var,iVar1))[1] = '\0';
    uVar2 = CONCAT44(extraout_var,iVar1) + 1;
    ctx->num = 0;
    if ((uVar2 & 0xffffffff80000000) != 0) {
      __assert_fail("encoded <= INT_MAX",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/base64/base64.cc"
                    ,0xa9,"void EVP_EncodeFinal(EVP_ENCODE_CTX *, uint8_t *, int *)");
    }
  }
  *outl = (int)uVar2;
  return;
}

Assistant:

void EVP_EncodeFinal(EVP_ENCODE_CTX *ctx, uint8_t *out, int *out_len) {
  if (ctx->data_used == 0) {
    *out_len = 0;
    return;
  }

  size_t encoded = EVP_EncodeBlock(out, ctx->data, ctx->data_used);
  out[encoded++] = '\n';
  out[encoded] = '\0';
  ctx->data_used = 0;

  // ctx->data_used is bounded by sizeof(ctx->data), so this does not
  // overflow.
  assert(encoded <= INT_MAX);
  *out_len = (int)encoded;
}